

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiView.cpp
# Opt level: O0

void testMultiView(string *param_1)

{
  ostream *poVar1;
  exception *e;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing multi-view channel list functions");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c89bf::testMultiViewFunctions();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testMultiView (const std::string&)
{
    try
    {
        cout << "Testing multi-view channel list functions" << endl;
        testMultiViewFunctions ();
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}